

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Build_Map.cpp
# Opt level: O3

void __thiscall
Build_Map::Build_Map
          (Build_Map *this,vector<double,_std::allocator<double>_> *_Boundary,double _xy_res,
          double _z_res,double _margin)

{
  double *pdVar1;
  int local_4c;
  int local_48;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  
  this->_vptr_Build_Map = (_func_int **)&PTR__Build_Map_00109cf8;
  local_40 = _margin;
  local_38 = _z_res;
  local_30 = _xy_res;
  std::vector<double,_std::allocator<double>_>::vector(&this->Boundary,_Boundary);
  (this->World).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->World).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->World).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->xy_res = local_30;
  this->z_res = local_38;
  this->margin = local_40;
  pdVar1 = (this->Boundary).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_4c = (int)((pdVar1[3] - *pdVar1) / local_30);
  local_48 = (int)((pdVar1[4] - pdVar1[1]) / local_30);
  local_44 = (int)((pdVar1[5] - pdVar1[2]) / local_38);
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->World,&local_4c);
  return;
}

Assistant:

Build_Map::Build_Map(std::vector<double> _Boundary, double _xy_res,
                     double _z_res, double _margin)
    : Boundary(_Boundary),
      xy_res(_xy_res),
      z_res(_z_res),
      margin(_margin) {
  int World_X = (Boundary[3] - Boundary[0]) / xy_res;  ///< X Dimension
  int World_Y = (Boundary[4] - Boundary[1]) / xy_res;  ///< Y Dimension
  int World_Z = (Boundary[5] - Boundary[2]) / z_res;  ///< Z Dimension
  World = {World_X, World_Y, World_Z};
}